

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_packing_pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::StructPackingPass::Process(StructPackingPass *this)

{
  bool bVar1;
  uint32_t id;
  Op OVar2;
  MessageConsumer *pMVar3;
  char *pcVar4;
  IRContext *this_00;
  DefUseManager *this_01;
  undefined1 local_90 [8];
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  structMemberTypes;
  undefined1 local_60 [8];
  string message;
  Instruction *structDef;
  undefined1 local_30 [4];
  uint32_t structIdToPack;
  StructPackingPass *local_18;
  StructPackingPass *this_local;
  
  local_18 = this;
  if (this->packingRules_ == Undefined) {
    pMVar3 = Pass::consumer(&this->super_Pass);
    bVar1 = std::function::operator_cast_to_bool((function *)pMVar3);
    if (bVar1) {
      pMVar3 = Pass::consumer(&this->super_Pass);
      memset(local_30,0,0x18);
      std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
      ::operator()(pMVar3,SPV_MSG_ERROR,"",(spv_position_t *)local_30,
                   "Cannot pack struct with undefined rule");
    }
    this_local._4_4_ = Failure;
  }
  else {
    buildConstantsMap(this);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    id = findStructIdByName(this,pcVar4);
    this_00 = Pass::context(&this->super_Pass);
    this_01 = IRContext::get_def_use_mgr(this_00);
    message.field_2._8_8_ = analysis::DefUseManager::GetDef(this_01,id);
    if (((Instruction *)message.field_2._8_8_ == (Instruction *)0x0) ||
       (OVar2 = opt::Instruction::opcode((Instruction *)message.field_2._8_8_),
       OVar2 != OpTypeStruct)) {
      pMVar3 = Pass::consumer(&this->super_Pass);
      bVar1 = std::function::operator_cast_to_bool((function *)pMVar3);
      if (bVar1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                       ,"Failed to find struct with name ",&this->structToPack_);
        pMVar3 = Pass::consumer(&this->super_Pass);
        memset(&structMemberTypes.
                super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,0,0x18);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        std::
        function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
        operator()(pMVar3,SPV_MSG_ERROR,"",
                   (spv_position_t *)
                   &structMemberTypes.
                    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar4);
        std::__cxx11::string::~string((string *)local_60);
      }
      this_local._4_4_ = Failure;
    }
    else {
      findStructMemberTypes
                ((vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                  *)local_90,this,(Instruction *)message.field_2._8_8_);
      this_local._4_4_ =
           assignStructMemberOffsets
                     (this,id,(vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                               *)local_90);
      std::
      vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
      ::~vector((vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                 *)local_90);
    }
  }
  return this_local._4_4_;
}

Assistant:

Pass::Status StructPackingPass::Process() {
  if (packingRules_ == PackingRules::Undefined) {
    if (consumer()) {
      consumer()(SPV_MSG_ERROR, "", {0, 0, 0},
                 "Cannot pack struct with undefined rule");
    }
    return Status::Failure;
  }

  // Build Id-to-instruction map for easier access
  buildConstantsMap();

  // Find structure of interest
  const uint32_t structIdToPack = findStructIdByName(structToPack_.c_str());

  const Instruction* structDef =
      context()->get_def_use_mgr()->GetDef(structIdToPack);
  if (structDef == nullptr || structDef->opcode() != spv::Op::OpTypeStruct) {
    if (consumer()) {
      const std::string message =
          "Failed to find struct with name " + structToPack_;
      consumer()(SPV_MSG_ERROR, "", {0, 0, 0}, message.c_str());
    }
    return Status::Failure;
  }

  // Find all struct member types
  std::vector<const analysis::Type*> structMemberTypes =
      findStructMemberTypes(*structDef);

  return assignStructMemberOffsets(structIdToPack, structMemberTypes);
}